

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_stamp.c
# Opt level: O0

err_t cmdFileStamp(octet *stamp,char *name,bool_t suffix)

{
  err_t eVar1;
  bool_t bVar2;
  blob_t pvVar3;
  void *buf_00;
  file_t pFVar4;
  size_t sVar5;
  file_t pFVar6;
  file_t der;
  int in_EDX;
  long in_RDI;
  size_t c;
  bool_t stamped;
  size_t count;
  file_t file;
  octet *state;
  octet *stamp2;
  octet *stamp1;
  octet *buf;
  octet *stack;
  err_t code;
  size_t buf_size;
  file_t in_stack_ffffffffffffff78;
  file_t in_stack_ffffffffffffff80;
  u32 tag;
  file_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint tag_00;
  err_t local_2c;
  err_t local_4;
  
  bashHash_keep();
  pvVar3 = blobCreate((size_t)in_stack_ffffffffffffff78);
  eVar1 = 0x6e;
  if (pvVar3 != (blob_t)0x0) {
    eVar1 = 0;
  }
  if (eVar1 != 0) {
    return eVar1;
  }
  buf_00 = (void *)((long)pvVar3 + 0x100a);
  pFVar4 = fileOpen((char *)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  eVar1 = 0xcb;
  if (pFVar4 != (file_t)0x0) {
    eVar1 = 0;
  }
  if (eVar1 != 0) {
    blobClose((blob_t)0x10c607);
    return eVar1;
  }
  pFVar4 = (file_t)fileSize(in_stack_ffffffffffffff88);
  local_2c = 0;
  if (pFVar4 == (file_t)0xffffffffffffffff) {
    local_2c = 0xcf;
  }
  if (local_2c != 0) {
    fileClose((file_t)0x10c645);
    blobClose((blob_t)0x10c64f);
    return local_2c;
  }
  tag_00 = 0;
  if ((in_EDX == 0) || (pFVar4 < (file_t)0xa)) goto LAB_0010c746;
  bVar2 = fileSeek(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,0);
  if ((bVar2 == 0) ||
     (sVar5 = fileRead2(pFVar4,CONCAT44(tag_00,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88)
     , sVar5 != 10)) {
LAB_0010c6c7:
    tag = (u32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    local_2c = 0xcf;
  }
  else {
    bVar2 = fileSeek(in_stack_ffffffffffffff80,(size_t)in_stack_ffffffffffffff78,0);
    tag = (u32)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    if (bVar2 == 0) goto LAB_0010c6c7;
  }
  if (local_2c != 0) {
    fileClose((file_t)0x10c6e0);
    blobClose((blob_t)0x10c6ea);
    return local_2c;
  }
  memRev(buf_00,10);
  sVar5 = derTOCTDec2((octet *)pFVar4,(octet *)CONCAT44(tag_00,in_stack_ffffffffffffff90),
                      (size_t)in_stack_ffffffffffffff88,tag,(size_t)in_stack_ffffffffffffff78);
  tag_00 = (uint)(sVar5 == 10);
  memRev(buf_00,10);
LAB_0010c746:
  if ((in_RDI == 0) && (tag_00 == 0)) {
    local_2c = 0xffffffff;
  }
  if (local_2c == 0) {
    if (tag_00 != 0) {
      pFVar4 = (file_t)(pFVar4[-1]._unused2 + 10);
    }
    der = pFVar4;
    bashHashStart(pFVar4,(size_t)in_stack_ffffffffffffff78);
    for (; der != (file_t)0x0; der = (file_t)((long)der - (long)in_stack_ffffffffffffff88)) {
      in_stack_ffffffffffffff78 = der;
      if ((file_t)0xfff < der) {
        in_stack_ffffffffffffff78 = (file_t)&DAT_00001000;
      }
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffff78;
      pFVar6 = (file_t)fileRead2(der,CONCAT44(tag_00,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff78);
      if (pFVar6 != in_stack_ffffffffffffff88) {
        local_2c = 0xcf;
      }
      if (local_2c != 0) {
        fileClose((file_t)0x10c82c);
        blobClose((blob_t)0x10c836);
        return local_2c;
      }
      bashHashStepH((void *)CONCAT44(tag_00,in_stack_ffffffffffffff90),
                    (size_t)in_stack_ffffffffffffff88,pFVar4);
    }
    bVar2 = fileClose((file_t)0x10c87b);
    local_2c = 0x67;
    if (bVar2 != 0) {
      local_2c = 0;
    }
    if (local_2c == 0) {
      bashHashStepG((octet *)CONCAT44(tag_00,in_stack_ffffffffffffff90),
                    (size_t)in_stack_ffffffffffffff88,pFVar4);
      derEnc((octet *)der,tag_00,in_stack_ffffffffffffff88,(size_t)pFVar4);
      memRev((void *)((long)pvVar3 + 0x1000),10);
      if (in_EDX != 0) {
        if (tag_00 == 0) {
          local_2c = 0xffffffff;
        }
        else {
          bVar2 = memEq((void *)((long)pvVar3 + 0x1000),buf_00,10);
          local_2c = 0xd2;
          if (bVar2 != 0) {
            local_2c = 0;
          }
        }
      }
      if (in_RDI != 0) {
        memCopy(pFVar4,in_stack_ffffffffffffff78,0x10c950);
      }
      blobClose((blob_t)0x10c95a);
      local_4 = local_2c;
    }
    else {
      blobClose((blob_t)0x10c89f);
      local_4 = local_2c;
    }
  }
  else {
    fileClose((file_t)0x10c76e);
    blobClose((blob_t)0x10c778);
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static err_t cmdFileStamp(
	octet* stamp,			/*!< [out] штамп */
	const char* name,		/*!< [in] имя файла */
	bool_t suffix			/*!< [in] анализировать суффикс */
)
{
	const size_t buf_size = 4096;
	err_t code;
	octet* stack;
	octet* buf;			/* [buf_size] */
	octet* stamp1;		/* [10] */
	octet* stamp2;		/* [10] */
	octet* state;		/* [bashHash_keep()] */
	file_t file;
	size_t count;
	bool_t stamped;
	// pre
	ASSERT((suffix == TRUE && stamp == 0) || memIsValid(stamp, 10));
	ASSERT(strIsValid(name));
	// выделить и разметить память
	code = cmdBlobCreate(stack, buf_size + 20 + bashHash_keep());
	ERR_CALL_CHECK(code);
	buf = stack;
	stamp1 = buf + buf_size;
	stamp2 = stamp1 + 10;
	state = stamp2 + 10;
	// открыть файл
	code = cmdFileOpen(file, name, "rb");
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// определить размер файла
	if ((count = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
	// штамп в суффиксе?
	stamped = FALSE;
	if (suffix && count >= 10)
	{
		if (!fileSeek(file, count - 10, SEEK_SET) ||
			fileRead2(stamp2, 10, file) != 10 ||
			!fileSeek(file, 0, SEEK_SET))
			code = ERR_FILE_READ;
		ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
		memRev(stamp2, 10);
		stamped = (derOCTDec2(0, stamp2, 10, 8) == 10);
		memRev(stamp2, 10);
	}
	if (stamp == 0 && !stamped)
		code = ERR_MAX;
	ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
	// определить объем хэшируемой части файла
	count = stamped ? count - 10 : count;
	// хэшировать файл
	bashHashStart(state, 32);
	while (count)
	{
		size_t c = MIN2(count, buf_size);
		if (fileRead2(buf, c, file) != c)
			code = ERR_FILE_READ;
		ERR_CALL_HANDLE(code, (cmdFileClose(file), cmdBlobClose(stack)));
		bashHashStepH(buf, c, state);
		count -= c;
	}
	// закрыть файл
	code = cmdFileClose(file);
	ERR_CALL_HANDLE(code, cmdBlobClose(stack));
	// завершить хэширование и кодировать
	bashHashStepG(stamp1, 8, state);
	VERIFY(derOCTEnc(stamp1, stamp1, 8) == 10);
	memRev(stamp1, 10);
	// проверить суффикс
	if (suffix)
	{
		if (stamped)
			code = memEq(stamp1, stamp2, 10) ? ERR_OK : ERR_FILE_STAMP;
		else
			code = ERR_MAX;
	}
	// возвратить штамп
	if (stamp)
		memCopy(stamp, stamp1, 10);
	// завершить
	cmdBlobClose(stack);
	return code;
}